

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::write_decimal<unsigned_int>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
           *this,uint value)

{
  ulong uVar1;
  bool bVar2;
  value_type vVar3;
  uint uVar4;
  uint uVar5;
  value_type *pvVar6;
  size_t sVar7;
  value_type vVar8;
  value_type *pvVar9;
  ulong uVar10;
  byte bVar11;
  long lVar12;
  value_type avStack_15 [13];
  
  uVar4 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar4 = (uVar4 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar5 = (uVar4 - (value < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                     (ulong)uVar4 * 4))) + 1;
  pvVar9 = avStack_15 + uVar5;
  uVar4 = value;
  if (99 < value) {
    do {
      value = uVar4 / 100;
      *(undefined2 *)(pvVar9 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar4 % 100) * 2);
      pvVar9 = pvVar9 + -2;
      bVar2 = 9999 < uVar4;
      uVar4 = uVar4 / 100;
    } while (bVar2);
  }
  pvVar6 = (this->out_).super_truncating_iterator_base<char_*>.out_;
  uVar1 = (this->out_).super_truncating_iterator_base<char_*>.limit_;
  sVar7 = (this->out_).super_truncating_iterator_base<char_*>.count_;
  vVar8 = (this->out_).blackhole_;
  if (value < 10) {
    bVar11 = (byte)value | 0x30;
    lVar12 = -1;
  }
  else {
    pvVar9[-1] = internal::basic_data<void>::DIGITS[((ulong)value * 2 & 0xffffffff) + 1];
    bVar11 = internal::basic_data<void>::DIGITS[(ulong)value * 2];
    lVar12 = -2;
  }
  pvVar9[lVar12] = bVar11;
  if (0 < (int)uVar5) {
    uVar10 = 0;
    do {
      vVar3 = avStack_15[uVar10];
      if (sVar7 + uVar10 < uVar1) {
        *pvVar6 = avStack_15[uVar10];
        vVar3 = vVar8;
      }
      vVar8 = vVar3;
      pvVar6 = pvVar6 + (sVar7 + uVar10 < uVar1);
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
    sVar7 = sVar7 + uVar10;
  }
  (this->out_).super_truncating_iterator_base<char_*>.out_ = pvVar6;
  (this->out_).super_truncating_iterator_base<char_*>.limit_ = uVar1;
  (this->out_).super_truncating_iterator_base<char_*>.count_ = sVar7;
  (this->out_).blackhole_ = vVar8;
  return;
}

Assistant:

inline int count_digits(uint32_t n) {
  int t = (32 - FMT_BUILTIN_CLZ(n | 1)) * 1233 >> 12;
  return t - (n < data::ZERO_OR_POWERS_OF_10_32[t]) + 1;
}